

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status
filemgr_read(filemgr *file,bid_t bid,void *buf,err_log_callback *log_callback,
            bool read_on_cache_miss)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  fdb_status fVar4;
  void *pvVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  err_log_callback *in_RCX;
  void *pvVar9;
  long in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  err_log_callback *unaff_R14;
  long *in_FS_OFFSET;
  bool bVar10;
  bool bVar11;
  void *unaff_retaddr;
  void *in_stack_00000008;
  bid_t in_stack_00000010;
  filemgr *in_stack_00000018;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  uint8_t marker;
  char *msg_3;
  char *msg_2;
  cs_off_t exp_filesize;
  size_t wait_count;
  uint64_t total_blocks;
  char *msg_1;
  fdb_status in_stack_000000bc;
  bool locked;
  bid_t is_writer;
  plock_entry_t *plock_entry;
  char *msg;
  uint64_t curr_pos;
  fdb_status status;
  uint64_t pos;
  ssize_t r;
  size_t lock_no;
  Func *in_stack_fffffffffffffe88;
  memory_order order;
  plock_entry_t *in_stack_fffffffffffffe90;
  filemgr *in_stack_fffffffffffffe98;
  function<void_()> *in_stack_fffffffffffffea0;
  undefined4 uVar12;
  filemgr *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  fdb_status fVar13;
  undefined4 in_stack_fffffffffffffeb4;
  undefined1 uVar14;
  uint64_t in_stack_fffffffffffffeb8;
  err_log_callback *log_callback_00;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  fdb_status local_124;
  void *in_stack_fffffffffffffef8;
  bid_t in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined8 in_stack_ffffffffffffff20;
  filemgr *in_stack_ffffffffffffff38;
  fdb_status local_94;
  long local_88;
  
  if ((char)in_FS_OFFSET[-0x19] == '\0') {
    pvVar5 = alloc_buf_for_readahead();
    in_FS_OFFSET[-0x1a] = (long)pvVar5;
    *(undefined1 *)(in_FS_OFFSET + -0x19) = 1;
  }
  if ((char)in_FS_OFFSET[-0x13] == '\0') {
    std::function<void()>::function<filemgr_read::__0,void>
              (in_stack_fffffffffffffea0,(anon_class_1_0_00000001 *)in_stack_fffffffffffffe98);
    FdbGcFunc::FdbGcFunc((FdbGcFunc *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::function<void_()>::~function((function<void_()> *)0x12d558);
    __cxa_thread_atexit(FdbGcFunc::~FdbGcFunc,*in_FS_OFFSET + -0xc0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x13) = 1;
  }
  uVar1 = *(uint *)(in_RDI + 2);
  local_94 = FDB_RESULT_SUCCESS;
  uVar6 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffe90,
                              (memory_order)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  uVar14 = (undefined1)((uint)in_stack_fffffffffffffeb4 >> 0x18);
  if (uVar6 <= in_RSI * uVar1) {
    fdb_log_impl(in_RCX,2,FDB_RESULT_READ_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                 ,"filemgr_read",0x7fd,
                 "Read error: read offset %lu exceeds the file\'s current offset %lu in a database file \'%s\'\n"
                 ,in_RSI * uVar1,uVar6,*in_RDI);
    return FDB_RESULT_READ_FAIL;
  }
  if (global_config.ncacheblock < 1) {
    if ((in_R8B & 1) == 0) {
      fdb_log_impl(in_RCX,2,FDB_RESULT_READ_FAIL,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_read",0x886,
                   "Read error: BID %lu in a database file \'%s\':block cache is not enabled.\n",
                   in_RSI,*in_RDI);
      return FDB_RESULT_READ_FAIL;
    }
    uVar7 = filemgr_read_block(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                               (bid_t)in_stack_fffffffffffffe98);
    uVar12 = (undefined4)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    if (uVar7 != *(uint *)(in_RDI + 2)) {
      _log_errno_str((filemgr_ops *)plock_entry,(err_log_callback *)is_writer,in_stack_000000bc,
                     msg_1,(char *)total_blocks);
      if ((long)uVar7 < 0) {
        fVar4 = (fdb_status)uVar7;
      }
      else {
        fVar4 = FDB_RESULT_READ_FAIL;
      }
      fVar13 = fVar4;
      fdb_log_impl(in_RCX,2,(fdb_status)(ulong)(uint)fVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_read",0x892,
                   "Read error: BID %lu in a database file \'%s\' is not read correctly: only %d bytes read (block cache disabled).\n"
                   ,in_RSI,*in_RDI,uVar7);
      if ((in_RCX != (err_log_callback *)0x0) && (in_RCX->callback != (fdb_log_callback)0x0)) {
        return fVar4;
      }
      dbg_print_buf((void *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffeb8,(bool)uVar14,fVar13);
      return fVar4;
    }
    local_94 = _filemgr_crc32_check(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    if (local_94 != FDB_RESULT_SUCCESS) {
      _log_errno_str((filemgr_ops *)plock_entry,(err_log_callback *)is_writer,in_stack_000000bc,
                     msg_1,(char *)total_blocks);
      fdb_log_impl(in_RCX,2,(fdb_status)(ulong)(uint)local_94,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_read",0x8a1,
                   "Read error: checksum error on BID %lu in a database file \'%s\' : marker %x (block cache disabled)\n"
                   ,in_RSI,*in_RDI,
                   CONCAT44(uVar12,(uint)*(byte *)(in_RDX + -1 + (ulong)*(uint *)(in_RDI + 2))));
      if ((in_RCX != (err_log_callback *)0x0) && (in_RCX->callback != (fdb_log_callback)0x0)) {
        return local_94;
      }
      dbg_print_buf((void *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffeb8,(bool)uVar14,in_stack_fffffffffffffeb0);
      return local_94;
    }
  }
  else {
    iVar3 = bcache_read((filemgr *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                        in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    bVar10 = iVar3 == 0;
    if (bVar10) {
      plock_lock((plock *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe98);
      iVar3 = bcache_read((filemgr *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                          in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    if (iVar3 == 0) {
      if ((in_R8B & 1) == 0) {
        if (bVar10) {
          plock_unlock((plock *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        }
        fdb_log_impl(in_RCX,2,FDB_RESULT_READ_FAIL,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                     ,"filemgr_read",0x821,
                     "Read error: BID %lu in a database file \'%s\' doesn\'t exist in the cache and read_on_cache_miss flag is turned on.\n"
                     ,in_RSI,*in_RDI);
        return FDB_RESULT_READ_FAIL;
      }
      uVar6 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffe90,
                                  (memory_order)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      uVar7 = uVar6 / *(uint *)(in_RDI + 2);
      pvVar5 = (void *)0x0;
      while (uVar14 = (undefined1)((uint)in_stack_fffffffffffffeb4 >> 0x18), uVar7 <= in_RSI) {
        in_stack_ffffffffffffff20 =
             (**(code **)(in_RDI[0x1d] + 0x20))(*(undefined4 *)((long)in_RDI + 0x14));
        atomic_init_uint64_t
                  ((atomic<unsigned_long> *)in_stack_fffffffffffffe90,
                   (uint64_t)in_stack_fffffffffffffe88);
        uVar6 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffe90,
                                    (memory_order)((ulong)in_stack_fffffffffffffe88 >> 0x20));
        uVar7 = uVar6 / *(uint *)(in_RDI + 2);
        pvVar9 = (void *)((long)pvVar5 + 1);
        bVar11 = pvVar5 != (void *)0x0;
        pvVar5 = pvVar9;
        if (bVar11) {
          usleep(1000);
          pvVar5 = pvVar9;
        }
      }
      if ((*(long *)(*in_FS_OFFSET + -0xd0) == 0) || (global_config.num_blocks_readahead == 0)) {
        uVar8 = filemgr_read_block(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                   (bid_t)in_stack_fffffffffffffe98);
        uVar12 = (undefined4)((ulong)in_stack_fffffffffffffea0 >> 0x20);
        order = (memory_order)((ulong)in_stack_fffffffffffffe88 >> 0x20);
        if (uVar8 != *(uint *)(in_RDI + 2)) {
          _log_errno_str((filemgr_ops *)plock_entry,(err_log_callback *)is_writer,in_stack_000000bc,
                         msg_1,(char *)total_blocks);
          if (bVar10) {
            plock_unlock((plock *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
          }
          if ((long)uVar8 < 0) {
            local_124 = (fdb_status)uVar8;
          }
          else {
            local_124 = FDB_RESULT_READ_FAIL;
          }
          uVar2 = *in_RDI;
          log_callback_00 = in_RCX;
          fVar4 = local_124;
          uVar6 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffe90,order);
          fdb_log_impl(log_callback_00,2,(fdb_status)(ulong)(uint)fVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,"filemgr_read",0x849,
                       "Read error: BID %lu in a database file \'%s\' is not read correctly: only %d bytes read, file size %zu.\n"
                       ,in_RSI,uVar2,uVar8,uVar6);
          if ((in_RCX == (err_log_callback *)0x0) || (in_RCX->callback == (fdb_log_callback)0x0)) {
            dbg_print_buf((void *)CONCAT44(fVar4,in_stack_fffffffffffffec0),
                          (uint64_t)log_callback_00,(bool)uVar14,in_stack_fffffffffffffeb0);
          }
          return local_124;
        }
        fVar4 = _filemgr_crc32_check(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          _log_errno_str((filemgr_ops *)plock_entry,(err_log_callback *)is_writer,in_stack_000000bc,
                         msg_1,(char *)total_blocks);
          if (bVar10) {
            plock_unlock((plock *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
          }
          fdb_log_impl(in_RCX,2,(fdb_status)(ulong)(uint)fVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,"filemgr_read",0x85b,
                       "Read error: checksum error on BID %lu in a database file \'%s\' : marker %x\n"
                       ,in_RSI,*in_RDI,
                       CONCAT44(uVar12,(uint)*(byte *)(in_RDX + -1 + (ulong)*(uint *)(in_RDI + 2))))
          ;
          if ((in_RCX != (err_log_callback *)0x0) && (in_RCX->callback != (fdb_log_callback)0x0)) {
            return fVar4;
          }
          dbg_print_buf((void *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffeb8,(bool)uVar14,in_stack_fffffffffffffeb0);
          return fVar4;
        }
        if (((global_config.do_not_cache_doc_blocks & 1U) == 0) ||
           (fVar4 = global_config.blocksize,
           *(char *)(in_RDX + -1 + (ulong)*(uint *)(in_RDI + 2)) == -1)) {
          fVar4 = bcache_write(in_stack_ffffffffffffff38,uVar7,pvVar5,
                               (bcache_dirty_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                               SUB81((ulong)in_stack_ffffffffffffff20 >> 0x18,0),
                               SUB81((ulong)in_stack_ffffffffffffff20 >> 0x10,0));
        }
        local_88 = (long)fVar4;
        local_94 = FDB_RESULT_SUCCESS;
        if (local_88 != global_config.blocksize) {
          if (bVar10) {
            plock_unlock((plock *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
          }
          _log_errno_str((filemgr_ops *)plock_entry,(err_log_callback *)is_writer,in_stack_000000bc,
                         msg_1,(char *)total_blocks);
          if (-1 < local_88) {
            fVar4 = FDB_RESULT_WRITE_FAIL;
          }
          fVar13 = fVar4;
          fdb_log_impl(in_RCX,2,(fdb_status)(ulong)(uint)fVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,"filemgr_read",0x876,
                       "Read error: BID %lu in a database file \'%s\' is not written in cache correctly: only %d bytes written.\n"
                       ,in_RSI,*in_RDI,local_88);
          if ((in_RCX != (err_log_callback *)0x0) && (in_RCX->callback != (fdb_log_callback)0x0)) {
            return fVar4;
          }
          dbg_print_buf((void *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffeb8,SUB41((uint)fVar13 >> 0x18,0),
                        in_stack_fffffffffffffeb0);
          return fVar4;
        }
      }
      else {
        local_94 = filemgr_do_readahead
                             (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                              unaff_R14);
        if (local_94 != FDB_RESULT_SUCCESS) {
          return local_94;
        }
      }
    }
    if (bVar10) {
      plock_unlock((plock *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    }
  }
  return local_94;
}

Assistant:

fdb_status filemgr_read(struct filemgr *file, bid_t bid, void *buf,
                        err_log_callback *log_callback,
                        bool read_on_cache_miss)
{
    thread_local void* buf_aligned = alloc_buf_for_readahead();
    thread_local FdbGcFunc gc([&](){ free_align(buf_aligned); });

    size_t lock_no;
    ssize_t r;
    uint64_t pos = bid * file->blocksize;
    fdb_status status = FDB_RESULT_SUCCESS;
    uint64_t curr_pos = atomic_get_uint64_t(&file->pos);

    if (pos >= curr_pos) {
        const char *msg = "Read error: read offset %" _F64 " exceeds the file's "
                          "current offset %" _F64 " in a database file '%s'\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                msg, pos, curr_pos, file->filename);
        return FDB_RESULT_READ_FAIL;
    }

    if (global_config.ncacheblock > 0) {
        lock_no = bid % DLOCK_MAX;
        (void)lock_no;

        plock_entry_t *plock_entry = NULL;
        bid_t is_writer = 0;
        bool locked = false; (void)locked;

        r = bcache_read(file, bid, buf);
        if (r == 0) {
            // Cache miss, grab lock and find once again.

            // WARNING:
            //   Regardless of writability, we SHOULD grab lock
            //   as reused blocks are immutable but writers can overwrite it
            //   and can update block cache sooner. Once race condition happens,
            //   reader may overwrite it using previous block.
            plock_entry = plock_lock(&file->plock, &bid, &is_writer);
            locked = true;
            r = bcache_read(file, bid, buf);
        }

        if (r == 0) {
            // Still cache miss, read from file.
            if (!read_on_cache_miss) {
                if (locked) {
                    plock_unlock(&file->plock, plock_entry);
                }
                const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                    "doesn't exist in the cache and read_on_cache_miss "
                    "flag is turned on.\n";
                fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                        msg, bid, file->filename);
                return FDB_RESULT_READ_FAIL;
            }

            uint64_t total_blocks = atomic_get_uint64_t(&file->latest_filesize) /
                                    file->blocksize;
            size_t wait_count = 0;
            while (bid >= total_blocks) {
                // This means blocks are asynchronously flushed from cache.
                // Should update file size.
                cs_off_t exp_filesize = file->ops->goto_eof(file->fd);
                atomic_init_uint64_t(&file->latest_filesize, exp_filesize);
                total_blocks = atomic_get_uint64_t(&file->latest_filesize) /
                               file->blocksize;
                if (wait_count++) {
                    usleep(1000);
                }
            }

            if ( buf_aligned &&
                 global_config.num_blocks_readahead ) {
                // Direct-IO mode, do read-ahead.
                status = filemgr_do_readahead(file, bid, buf, buf_aligned, log_callback);
                if (status != FDB_RESULT_SUCCESS) return status;

            } else {
                // if normal file, just read a block
                r = filemgr_read_block(file, buf, bid);
                if (r != (ssize_t)file->blocksize) {
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) r, "READ", file->filename);
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    const char *msg = "Read error: BID %" _F64
                        " in a database file '%s' is not read correctly: "
                        "only %d bytes read, file size %zu.\n";
                    status = r < 0 ? (fdb_status)r : FDB_RESULT_READ_FAIL;
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid, file->filename, r,
                            atomic_get_uint64_t(&file->latest_filesize));
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }

                status = _filemgr_crc32_check(file, buf);
                if (status != FDB_RESULT_SUCCESS) {
                    _log_errno_str(file->ops, log_callback, status, "READ",
                            file->filename);
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    const char *msg = "Read error: checksum error on BID %" _F64
                        " in a database file '%s' : marker %x\n";
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid,
                            file->filename, *((uint8_t*)buf + file->blocksize-1));
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }

                uint8_t marker = *((uint8_t*)buf + file->blocksize - 1);
                if ( global_config.do_not_cache_doc_blocks &&
                     marker != BLK_MARKER_BNODE ) {
                    // If caching option is ON, and not a B-tree block,
                    // we do not put it into cache.
                    r = global_config.blocksize;
                } else {
                    r = bcache_write(file, bid, buf, BCACHE_REQ_CLEAN, false, false);
                }

                if (r != global_config.blocksize) {
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) r, "WRITE", file->filename);
                    const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                        "is not written in cache correctly: only %d bytes written.\n";
                    status = r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid, file->filename, r);
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }
            }
        }
        if (locked) {
            plock_unlock(&file->plock, plock_entry);
        }
    } else {
        if (!read_on_cache_miss) {
            const char *msg = "Read error: BID %" _F64 " in a database file '%s':"
                "block cache is not enabled.\n";
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                    msg, bid, file->filename);
            return FDB_RESULT_READ_FAIL;
        }

        r = filemgr_read_block(file, buf, bid);
        if (r != (ssize_t)file->blocksize) {
            _log_errno_str(file->ops, log_callback, (fdb_status) r, "READ",
                           file->filename);
            const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                "is not read correctly: only %d bytes read (block cache disabled).\n";
            status = (r < 0)? (fdb_status)r : FDB_RESULT_READ_FAIL;
            fdb_log(log_callback, FDB_LOG_ERROR, status,
                    msg, bid, file->filename, r);
            if (!log_callback || !log_callback->callback) {
                dbg_print_buf(buf, file->blocksize, true, 16);
            }
            return status;
        }

        status = _filemgr_crc32_check(file, buf);
        if (status != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, status, "READ",
                           file->filename);
            const char *msg = "Read error: checksum error on BID %" _F64 " in a database file '%s' "
                ": marker %x (block cache disabled)\n";
            fdb_log(log_callback, FDB_LOG_ERROR, status,
                    msg, bid,
                    file->filename, *((uint8_t*)buf + file->blocksize-1));
            if (!log_callback || !log_callback->callback) {
                dbg_print_buf(buf, file->blocksize, true, 16);
            }
            return status;
        }

    }
    return status;
}